

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_insertAString_success_middleIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined8 uStack_80;
  AString srcString;
  AString destString;
  
  destString.reallocator = private_ACUtilsTest_AString_realloc;
  destString.deallocator = private_ACUtilsTest_AString_free;
  destString.size = 5;
  destString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_80 = 0x1277b2;
  destString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(destString.buffer,"01567",6);
  srcString.reallocator = private_ACUtilsTest_AString_realloc;
  srcString.deallocator = private_ACUtilsTest_AString_free;
  srcString.size = 3;
  srcString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_80 = 0x1277fd;
  srcString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(srcString.buffer,"234",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_80 = 0x12782c;
  bVar1 = AString_insertAString(&destString,2,&srcString);
  if (bVar1 == false) {
    uStack_80 = 0x1279c2;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x336,
                      "Assertion \'AString_insertAString(&destString, 2, &srcString)\' failed",0,0);
  }
  uStack_80 = 0x127845;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x336);
  if (destString.capacity != 8) {
    local_90 = "(8)";
    pcVar8 = "(destString).capacity == (8)";
    pcVar4 = "(destString).capacity";
    pcVar5 = (char *)destString.capacity;
LAB_00127aac:
    iVar2 = 0x337;
LAB_00127ae2:
    local_88 = (char *)0x8;
LAB_00127bbf:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_90;
    goto LAB_00127bc1;
  }
  uStack_80 = 0x127865;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x337);
  if (destString.buffer == (char *)0x0) {
    ppcVar7 = &local_88;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (destString).buffer != NULL";
    pcVar9 = "(void*) (destString).buffer";
    iVar2 = 0x337;
    goto LAB_00127c0c;
  }
  uStack_80 = 0x127882;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x337);
  pcVar9 = destString.buffer;
  if (destString.buffer == (char *)0x0) {
    pcVar5 = "";
    pcVar9 = "(null)";
LAB_00127a40:
    local_90 = "01234567";
    pcStack_a0 = "(\"01234567\")";
    pcVar8 = "(destString).buffer == (\"01234567\")";
    pcVar4 = "(void*) (destString).buffer";
    iVar2 = 0x337;
  }
  else {
    uStack_80 = 0x12789f;
    iVar2 = strcmp("01234567",destString.buffer);
    if (iVar2 != 0) {
      pcVar5 = "\"";
      goto LAB_00127a40;
    }
    uStack_80 = 0x1278b8;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x337);
    if (destString.size != 8) {
      local_90 = "strlen(\"01234567\")";
      pcVar8 = "(destString).size == strlen(\"01234567\")";
      pcVar4 = "(destString).size";
      pcVar5 = (char *)destString.size;
      goto LAB_00127aac;
    }
    uStack_80 = 0x1278d8;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x337);
    if (srcString.capacity != 8) {
      local_90 = "(8)";
      pcVar8 = "(srcString).capacity == (8)";
      pcVar4 = "(srcString).capacity";
      iVar2 = 0x338;
      pcVar5 = (char *)srcString.capacity;
      goto LAB_00127ae2;
    }
    uStack_80 = 0x1278f8;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x338);
    if (srcString.buffer == (char *)0x0) {
      ppcVar7 = &local_88;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (srcString).buffer != NULL";
      pcVar9 = "(void*) (srcString).buffer";
      iVar2 = 0x338;
LAB_00127c0c:
      uStack_80 = 0;
      local_88 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) = test_AString_insertAString_success_endIndex_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_80 = 0x127915;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x338);
    pcVar9 = srcString.buffer;
    if (srcString.buffer == (char *)0x0) {
      pcVar9 = "(null)";
      pcVar5 = "";
    }
    else {
      uStack_80 = 0x127932;
      iVar2 = strcmp("234",srcString.buffer);
      if (iVar2 == 0) {
        uStack_80 = 0x12794b;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x338);
        if (srcString.size == 3) {
          uStack_80 = 0x12796b;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x338);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_80 = 0x12798c;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x339);
            uStack_80 = 0x127995;
            (*destString.deallocator)(destString.buffer);
            uStack_80 = 0x12799e;
            (*srcString.deallocator)(srcString.buffer);
            return;
          }
          ppcVar7 = &local_98;
          local_90 = "(0)";
          local_98 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x339;
          goto LAB_00127c0c;
        }
        local_90 = "strlen(\"234\")";
        pcVar8 = "(srcString).size == strlen(\"234\")";
        pcVar4 = "(srcString).size";
        iVar2 = 0x338;
        local_88 = (char *)0x3;
        pcVar5 = (char *)srcString.size;
        goto LAB_00127bbf;
      }
      pcVar5 = "\"";
    }
    local_90 = "234";
    pcStack_a0 = "(\"234\")";
    pcVar8 = "(srcString).buffer == (\"234\")";
    pcVar4 = "(void*) (srcString).buffer";
    iVar2 = 0x338;
  }
  pcVar4 = pcVar4 + 8;
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_88 = "\"";
  local_98 = "\"";
  ppcVar6 = &pcStack_b0;
  pcStack_b0 = pcVar9;
  pcStack_a8 = pcVar5;
LAB_00127bc1:
  uStack_80 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar5;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x127bc8;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar8,pcVar4);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}